

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O1

void __thiscall CCharmapToUni8859_1::CCharmapToUni8859_1(CCharmapToUni8859_1 *this)

{
  char *pcVar1;
  long lVar2;
  wchar_t i;
  int iVar3;
  
  *(undefined4 *)&(this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic.field_0x8 = 1;
  *(undefined ***)&(this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic =
       &PTR__CCharmap_00354568;
  lVar2 = 0x83;
  do {
    pcVar1 = (this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic.inbuf_ + lVar2 * 4 + -0xc;
    pcVar1[0] = -3;
    pcVar1[1] = -1;
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = -3;
    pcVar1[5] = -1;
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = -3;
    pcVar1[9] = -1;
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = -3;
    pcVar1[0xd] = -1;
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x183);
  *(undefined ***)&(this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic =
       &PTR__CCharmap_00354b38;
  iVar3 = 0;
  do {
    (**(code **)(*(long *)&(this->super_CCharmapToUniSB).super_CCharmapToUniSB_basic + 0x38))
              (this,iVar3,iVar3);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x100);
  return;
}

Assistant:

CCharmapToUni8859_1()
    {
        wchar_t i;
        
        /* 
         *   Initialize our mapping table.  Each 8859-1 code point maps to
         *   the same code point in Unicode, so this is a trivial
         *   translation.  
         */
        for (i = 0 ; i < 256 ; ++i)
            set_mapping(i, i);
    }